

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O0

ares_status_t ares_uri_parse_query(ares_uri_t *uri,ares_buf_t *buf)

{
  size_t sVar1;
  size_t len;
  ares_buf_t *query;
  ares_status_t status;
  uchar b;
  ares_buf_t *buf_local;
  ares_uri_t *uri_local;
  
  len = 0;
  _status = buf;
  buf_local = (ares_buf_t *)uri;
  sVar1 = ares_buf_len(buf);
  if (sVar1 == 0) {
    uri_local._4_4_ = ARES_SUCCESS;
  }
  else {
    query._0_4_ = ares_buf_peek_byte(_status,(uchar *)((long)&query + 7));
    uri_local._4_4_ = (ares_status_t)query;
    if ((ares_status_t)query == ARES_SUCCESS) {
      if (query._7_1_ == '?') {
        ares_buf_consume(_status,1);
        ares_buf_tag(_status);
        sVar1 = ares_buf_consume_until_charset(_status,"#",1,ARES_FALSE);
        if (sVar1 == 0) {
          uri_local._4_4_ = ARES_SUCCESS;
        }
        else {
          query._0_4_ = ares_buf_tag_fetch_constbuf(_status,(ares_buf_t **)&len);
          uri_local._4_4_ = (ares_status_t)query;
          if ((ares_status_t)query == ARES_SUCCESS) {
            query._0_4_ = ares_uri_parse_query_buf((ares_uri_t *)buf_local,(ares_buf_t *)len);
            ares_buf_destroy((ares_buf_t *)len);
            uri_local._4_4_ = (ares_status_t)query;
          }
        }
      }
      else {
        uri_local._4_4_ = ARES_SUCCESS;
      }
    }
  }
  return uri_local._4_4_;
}

Assistant:

static ares_status_t ares_uri_parse_query(ares_uri_t *uri, ares_buf_t *buf)
{
  unsigned char b;
  ares_status_t status;
  ares_buf_t   *query = NULL;
  size_t        len;

  if (ares_buf_len(buf) == 0) {
    return ARES_SUCCESS;
  }

  status = ares_buf_peek_byte(buf, &b);
  if (status != ARES_SUCCESS) {
    return status;
  }

  /* Not a query, must be one of the others */
  if (b != '?') {
    return ARES_SUCCESS;
  }

  /* Only possible terminator is fragment indicator of '#' */
  ares_buf_consume(buf, 1);
  ares_buf_tag(buf);
  len = ares_buf_consume_until_charset(buf, (const unsigned char *)"#", 1,
                                       ARES_FALSE);
  if (len == 0) {
    /* No data, return */
    return ARES_SUCCESS;
  }

  status = ares_buf_tag_fetch_constbuf(buf, &query);
  if (status != ARES_SUCCESS) {
    return status;
  }

  status = ares_uri_parse_query_buf(uri, query);
  ares_buf_destroy(query);

  return status;
}